

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

Lit __thiscall Minisat::Solver::pickBranchLit(Solver *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  char *__function;
  byte bVar4;
  bool bVar5;
  double dVar6;
  
  dVar6 = this->random_seed * 1389796.0;
  dVar6 = dVar6 - (double)(int)(dVar6 / 2147483647.0) * 2147483647.0;
  this->random_seed = dVar6;
  iVar3 = -1;
  if ((dVar6 / 2147483647.0 < this->random_var_freq) &&
     (iVar2 = (this->order_heap).heap.sz, iVar2 != 0)) {
    dVar6 = dVar6 * 1389796.0 - (double)(int)((dVar6 * 1389796.0) / 2147483647.0) * 2147483647.0;
    this->random_seed = dVar6;
    iVar3 = (int)((double)iVar2 * (dVar6 / 2147483647.0));
    if (iVar2 <= iVar3) {
      __assert_fail("index < heap.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/Heap.h"
                    ,0x52,
                    "int Minisat::Heap<int, Minisat::Solver::VarOrderLt>::operator[](int) const [K = int, Comp = Minisat::Solver::VarOrderLt, MkIndex = Minisat::MkIndexDefault<int>]"
                   );
    }
    iVar3 = (this->order_heap).heap.data[iVar3];
    if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
        iVar3) {
LAB_0010a6bc:
      __assert_fail("has(k)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                    ,0x27,
                    "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                   );
    }
    bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
            data[iVar3].value;
    if (bVar1 == l_Undef && (l_Undef & 2) == 0 || (l_Undef & 2 & bVar1) != 0) {
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar3) {
LAB_0010a6db:
        __function = 
        "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
        ;
LAB_0010a6f0:
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/luciferxiaozhi[P]VertexCover_CNFSAT_/minisat/minisat/mtl/IntMap.h"
                      ,0x28,__function);
      }
      if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar3] !=
          '\0') {
        this->rnd_decisions = this->rnd_decisions + 1;
      }
    }
  }
  do {
    if (iVar3 != -1) {
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          iVar3) goto LAB_0010a6bc;
      bVar1 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[iVar3].value;
      bVar4 = l_Undef & 2;
      if (bVar1 == l_Undef && bVar4 == 0 || (bVar4 & bVar1) != 0) {
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz <= iVar3)
        goto LAB_0010a6db;
        if ((this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data[iVar3]
            != '\0') {
          if ((this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              sz <= iVar3) {
            __function = 
            "V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
            ;
            goto LAB_0010a6f0;
          }
          bVar1 = (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.
                  map.data[iVar3].value;
          if ((bVar1 != l_Undef || bVar4 != 0) && (bVar1 & 2 & l_Undef) == 0) {
            bVar5 = bVar1 == l_True && (l_True & 2) == 0 || (bVar1 & 2 & l_True) != 0;
          }
          else {
            if (this->rnd_pol != true) {
              if (iVar3 < (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.
                          map.sz) {
                return (Lit)((uint)((this->polarity).
                                    super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data
                                    [iVar3] != '\0') + iVar3 * 2);
              }
              goto LAB_0010a6db;
            }
            dVar6 = this->random_seed * 1389796.0;
            dVar6 = dVar6 - (double)(int)(dVar6 / 2147483647.0) * 2147483647.0;
            this->random_seed = dVar6;
            bVar5 = dVar6 / 2147483647.0 < 0.5;
          }
          return (Lit)((uint)bVar5 + iVar3 * 2);
        }
      }
    }
    if ((this->order_heap).heap.sz == 0) {
      return (Lit)-2;
    }
    iVar3 = Heap<int,_Minisat::Solver::VarOrderLt,_Minisat::MkIndexDefault<int>_>::removeMin
                      (&this->order_heap);
  } while( true );
}

Assistant:

Lit Solver::pickBranchLit()
{
    Var next = var_Undef;

    // Random decision:
    if (drand(random_seed) < random_var_freq && !order_heap.empty()){
        next = order_heap[irand(random_seed,order_heap.size())];
        if (value(next) == l_Undef && decision[next])
            rnd_decisions++; }

    // Activity based decision:
    while (next == var_Undef || value(next) != l_Undef || !decision[next])
        if (order_heap.empty()){
            next = var_Undef;
            break;
        }else
            next = order_heap.removeMin();

    // Choose polarity based on different polarity modes (global or per-variable):
    if (next == var_Undef)
        return lit_Undef;
    else if (user_pol[next] != l_Undef)
        return mkLit(next, user_pol[next] == l_True);
    else if (rnd_pol)
        return mkLit(next, drand(random_seed) < 0.5);
    else
        return mkLit(next, polarity[next]);
}